

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reinsertion_optimizer.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
bvh::v2::ReinsertionOptimizer<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>::
compute_parents<bvh::v2::ParallelExecutor>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          Executor<bvh::v2::ParallelExecutor> *executor,
          Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *bvh)

{
  ThreadPool *this;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *pBVar1;
  size_type __n;
  reference pvVar2;
  pointer end;
  size_t sVar3;
  unsigned_long *puVar4;
  Task *task;
  anon_class_16_2_7fbdbc5e local_108 [2];
  allocator<unsigned_long> local_e2;
  undefined1 local_e1;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_e0;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *bvh_local;
  Executor<bvh::v2::ParallelExecutor> *executor_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *parents;
  pointer local_c0;
  undefined8 local_b8;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_b0;
  anon_class_32_3_6bb9c804 local_98;
  function<void_(unsigned_long)> local_78;
  _Manager_type local_58;
  unsigned_long local_50;
  size_t next;
  size_t i;
  unsigned_long local_38;
  _Manager_type local_30;
  unsigned_long chunk_size;
  pointer local_20;
  size_t local_18;
  Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *local_10;
  
  local_e1 = 0;
  local_e0 = bvh;
  bvh_local = (Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> *)executor;
  executor_local = (Executor<bvh::v2::ParallelExecutor> *)__return_storage_ptr__;
  __n = std::
        vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
        ::size(&bvh->nodes);
  std::allocator<unsigned_long>::allocator(&local_e2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,__n,&local_e2);
  std::allocator<unsigned_long>::~allocator(&local_e2);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (__return_storage_ptr__,0);
  pBVar1 = bvh_local;
  *pvVar2 = 0;
  end = (pointer)std::
                 vector<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                 ::size(&local_e0->nodes);
  local_108[0].bvh = local_e0;
  local_b0 = pBVar1;
  local_b8 = 0;
  parents = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_108;
  local_10 = pBVar1;
  local_18 = 0;
  local_108[0].parents = __return_storage_ptr__;
  local_c0 = end;
  chunk_size = (unsigned_long)parents;
  local_20 = end;
  if (end < (pBVar1->nodes).
            super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
    compute_parents<bvh::v2::ParallelExecutor>::anon_class_16_2_7fbdbc5e::operator()
              ((anon_class_16_2_7fbdbc5e *)parents,0,(size_t)end);
  }
  else {
    local_38 = 1;
    sVar3 = ThreadPool::get_thread_count
                      ((ThreadPool *)
                       (pBVar1->nodes).
                       super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    i = (ulong)end / sVar3;
    task = (Task *)&i;
    puVar4 = std::max<unsigned_long>(&local_38,(unsigned_long *)task);
    local_30 = (_Manager_type)*puVar4;
    for (next = local_18; next < local_20; next = (size_t)(local_30 + next)) {
      local_58 = local_30 + next;
      puVar4 = std::min<unsigned_long>((unsigned_long *)&local_20,(unsigned_long *)&local_58);
      local_98.next = *puVar4;
      this = (ThreadPool *)
             (pBVar1->nodes).
             super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      local_98.loop.bvh = *(Bvh<bvh::v2::Node<float,_3UL,_32UL,_4UL>_> **)chunk_size;
      local_98.loop.parents =
           *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)(chunk_size + 8);
      local_98.i = next;
      local_50 = local_98.next;
      std::function<void_(unsigned_long)>::
      function<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_madmann91[P]bvh_src_bvh_v2_executor_h:58:30),_void>
                (&local_78,&local_98);
      task = &local_78;
      ThreadPool::push(this,task);
      std::function<void_(unsigned_long)>::~function(&local_78);
    }
    ThreadPool::wait((ThreadPool *)
                     (pBVar1->nodes).
                     super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,task);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<size_t> compute_parents(Executor<Derived>& executor, const Bvh<Node>& bvh) {
        std::vector<size_t> parents(bvh.nodes.size());
        parents[0] = 0;
        executor.for_each(0, bvh.nodes.size(),
            [&] (size_t begin, size_t end) {
                for (size_t i = begin; i < end; ++i) {
                    auto& node = bvh.nodes[i];
                    if (!node.is_leaf()) {
                        parents[node.index.first_id() + 0] = i;
                        parents[node.index.first_id() + 1] = i;
                    }
                }
            });
        return parents;
    }